

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mipmapped_texture::crop(mipmapped_texture *this,uint x,uint y,uint width,uint height)

{
  bool bVar1;
  uint uVar2;
  component_flags new_flags;
  mip_level *pmVar3;
  image_u8 *this_00;
  image<crnlib::color_quad<unsigned_char,_int>_> *this_01;
  color_quad<unsigned_char,_int> *pDst;
  vector<crnlib::mip_level_*> *pvVar4;
  mip_level **ppmVar5;
  uint *init1;
  undefined1 local_90 [8];
  face_vec faces;
  image_u8 *pMip;
  image_u8 *pImg;
  image_u8 tmp;
  uint height_local;
  uint width_local;
  uint y_local;
  uint x_local;
  mipmapped_texture *this_local;
  
  tmp.m_pixel_buf.m_size = height;
  tmp.m_pixel_buf.m_capacity = width;
  bVar1 = is_valid(this);
  if (bVar1) {
    uVar2 = get_num_faces(this);
    if (uVar2 < 2) {
      if ((tmp.m_pixel_buf.m_capacity == 0) || (tmp.m_pixel_buf.m_size == 0)) {
        this_local._7_1_ = false;
      }
      else {
        image<crnlib::color_quad<unsigned_char,_int>_>::image
                  ((image<crnlib::color_quad<unsigned_char,_int>_> *)&pImg);
        pmVar3 = get_level(this,0,0);
        this_00 = mip_level::get_unpacked_image(pmVar3,(image_u8 *)&pImg,3);
        this_01 = crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>,unsigned_int,unsigned_int>
                            ((crnlib *)&tmp.m_pixel_buf.m_capacity,&tmp.m_pixel_buf.m_size,init1);
        pDst = image<crnlib::color_quad<unsigned_char,_int>_>::get_ptr(this_01);
        this_local._7_1_ =
             image<crnlib::color_quad<unsigned_char,_int>_>::extract_block
                       (this_00,pDst,x,y,tmp.m_pixel_buf.m_capacity,tmp.m_pixel_buf.m_size,false);
        if (this_local._7_1_) {
          vector<crnlib::vector<crnlib::mip_level_*>_>::vector
                    ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_90,1);
          pvVar4 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                             ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_90,0);
          vector<crnlib::mip_level_*>::resize(pvVar4,1,false);
          pmVar3 = crnlib_new<crnlib::mip_level>();
          pvVar4 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                             ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_90,0);
          ppmVar5 = vector<crnlib::mip_level_*>::operator[](pvVar4,0);
          *ppmVar5 = pmVar3;
          new_flags = image<crnlib::color_quad<unsigned_char,_int>_>::get_comp_flags(this_00);
          image<crnlib::color_quad<unsigned_char,_int>_>::set_comp_flags(this_01,new_flags);
          pvVar4 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                             ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_90,0);
          ppmVar5 = vector<crnlib::mip_level_*>::operator[](pvVar4,0);
          mip_level::assign(*ppmVar5,this_01,PIXEL_FMT_INVALID,cDefaultOrientationFlags);
          assign(this,(face_vec *)local_90);
          faces.m_capacity = 1;
          vector<crnlib::vector<crnlib::mip_level_*>_>::~vector
                    ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_90);
        }
        else {
          faces.m_capacity = 1;
        }
        image<crnlib::color_quad<unsigned_char,_int>_>::~image
                  ((image<crnlib::color_quad<unsigned_char,_int>_> *)&pImg);
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool mipmapped_texture::crop(uint x, uint y, uint width, uint height) {
  CRNLIB_ASSERT(is_valid());
  if (!is_valid())
    return false;
  if (get_num_faces() > 1)
    return false;

  if ((width < 1) || (height < 1))
    return false;

  image_u8 tmp;
  image_u8* pImg = get_level(0, 0)->get_unpacked_image(tmp, cUnpackFlagUncook | cUnpackFlagUnflip);

  image_u8* pMip = crnlib_new<image_u8>(width, height);

  if (!pImg->extract_block(pMip->get_ptr(), x, y, width, height))
    return false;

  face_vec faces(1);
  faces[0].resize(1);
  faces[0][0] = crnlib_new<mip_level>();

  pMip->set_comp_flags(pImg->get_comp_flags());

  faces[0][0]->assign(pMip);

  assign(faces);

  CRNLIB_ASSERT(check());

  return true;
}